

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.c
# Opt level: O0

void dpf_cb(block input)

{
  uint64_t in_XMM0_Qa;
  uint64_t in_XMM0_Qb;
  uint64_t *val;
  block input_local;
  
  _output_bit_to_bit(in_XMM0_Qa);
  _output_bit_to_bit(in_XMM0_Qb);
  printf("\n");
  return;
}

Assistant:

void dpf_cb(block input) {
    uint64_t *val = (uint64_t *) &input;

	//printf("%016lx%016lx\n", val[0], val[1]);
	_output_bit_to_bit(val[0]);
	_output_bit_to_bit(val[1]);
	printf("\n");
}